

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

int luaL_loadfilex(lua_State *L,char *filename,char *mode)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *local_2070;
  char *chunkname;
  FILE *pFStack_2060;
  int status;
  FileReaderCtx ctx;
  char *mode_local;
  char *filename_local;
  lua_State *L_local;
  
  ctx.buf._8184_8_ = mode;
  if (filename == (char *)0x0) {
    pFStack_2060 = _stdin;
    local_2070 = "=stdin";
  }
  else {
    pFStack_2060 = fopen64(filename,"rb");
    if (pFStack_2060 == (FILE *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      lua_pushfstring(L,"cannot open %s: %s",filename,pcVar3);
      return 6;
    }
    local_2070 = lua_pushfstring(L,"@%s",filename);
  }
  L_local._4_4_ =
       lua_loadx(L,reader_file,&stack0xffffffffffffdfa0,local_2070,(char *)ctx.buf._8184_8_);
  iVar1 = ferror(pFStack_2060);
  if (iVar1 == 0) {
    if (filename != (char *)0x0) {
      L->top = L->top + -1;
      L->top[-1] = *L->top;
      fclose(pFStack_2060);
    }
  }
  else {
    iVar1 = 1;
    if (filename != (char *)0x0) {
      iVar1 = 2;
    }
    L->top = L->top + -(long)iVar1;
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    lua_pushfstring(L,"cannot read %s: %s",local_2070 + 1,pcVar3);
    if (filename != (char *)0x0) {
      fclose(pFStack_2060);
    }
    L_local._4_4_ = 6;
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_loadfilex(lua_State *L, const char *filename,
			      const char *mode)
{
  FileReaderCtx ctx;
  int status;
  const char *chunkname;
  if (filename) {
    ctx.fp = fopen(filename, "rb");
    if (ctx.fp == NULL) {
      lua_pushfstring(L, "cannot open %s: %s", filename, strerror(errno));
      return LUA_ERRFILE;
    }
    chunkname = lua_pushfstring(L, "@%s", filename);
  } else {
    ctx.fp = stdin;
    chunkname = "=stdin";
  }
  status = lua_loadx(L, reader_file, &ctx, chunkname, mode);
  if (ferror(ctx.fp)) {
    L->top -= filename ? 2 : 1;
    lua_pushfstring(L, "cannot read %s: %s", chunkname+1, strerror(errno));
    if (filename)
      fclose(ctx.fp);
    return LUA_ERRFILE;
  }
  if (filename) {
    L->top--;
    copyTV(L, L->top-1, L->top);
    fclose(ctx.fp);
  }
  return status;
}